

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateImplementation.cpp
# Opt level: O3

double __thiscall
Js::DateImplementation::SetDateData
          (DateImplementation *this,Arguments *args,DateData dd,bool fUtc,
          ScriptContext *scriptContext)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Var aValue;
  DateImplementation *pDVar5;
  uint idxArg;
  ulong uVar6;
  double dVar7;
  Type TVar8;
  YMD emptyYMD;
  double local_90 [2];
  double rgdbl [5];
  
  if (9 < dd._value) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                ,0x687,"(false)","DateData type invalid");
    if (bVar3) {
      *puVar4 = 0;
      JavascriptError::ThrowError(scriptContext,-0x7ff5ffcd,(PCWSTR)0x0);
    }
LAB_00b3eae0:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  if (dd._value < 8 && ((ulong)args->Info & 0xffffff) != 1) {
    local_90[0] = (double)(ulong)dd._value;
    uVar1 = *(uint *)(mpddcvar + (long)local_90[0] * 4);
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    uVar6 = 1;
    do {
      idxArg = (uint)uVar6;
      aValue = Arguments::operator[](args,idxArg);
      if (((ulong)aValue & 0x1ffff00000000) == 0x1000000000000 ||
          ((ulong)aValue & 0xffff000000000000) != 0x1000000000000) {
        if (((ulong)aValue & 0xffff000000000000) == 0x1000000000000) goto LAB_00b3e63d;
        if ((ulong)aValue >> 0x32 == 0) {
          dVar7 = JavascriptConversion::ToNumber_Full(aValue,scriptContext);
        }
        else {
          dVar7 = (double)((ulong)aValue ^ 0xfffc000000000000);
        }
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar3) goto LAB_00b3eae0;
        *puVar4 = 0;
LAB_00b3e63d:
        dVar7 = (double)(int)aValue;
      }
      bVar3 = NumberUtilities::IsFinite(dVar7);
      if (!bVar3) goto LAB_00b3e6f7;
      dVar7 = ConvertToInteger(dVar7);
      local_90[uVar6] = dVar7;
    } while ((uVar6 < (*(uint *)&args->Info & 0xffffff) - 1) &&
            (bVar3 = uVar6 < uVar1, uVar6 = uVar6 + 1, bVar3));
    bVar3 = NumberUtilities::IsNan(this->m_tvUtc);
    if (bVar3) {
      if (dd._value == '\0') {
        if ((local_90[1] < 100.0) && (0.0 <= local_90[1])) {
          local_90[1] = local_90[1] + 1900.0;
        }
      }
      else if (local_90[0]._0_4_ != 1) goto LAB_00b3e6f7;
      if ((idxArg < 3) && (rgdbl[1] = 1.0, idxArg != 2)) {
        rgdbl[0] = 0.0;
      }
      TVar8 = DateUtilities::TvFromDate(local_90[1],rgdbl[0],rgdbl[1] + -1.0,0.0);
    }
    else {
      uVar1 = this->m_grfval;
      if (fUtc) {
        pDVar5 = this;
        if ((uVar1 & 4) == 0) {
          DateUtilities::GetYmdFromTv(this->m_tvUtc,&this->m_ymdUtc);
          *(byte *)&this->m_grfval = (byte)this->m_grfval | 4;
        }
      }
      else {
        if ((uVar1 & 2) == 0) {
          if ((uVar1 & 1) == 0) {
            TVar8 = GetTvLcl<Js::ScriptContext>(this->m_tvUtc,scriptContext,&this->m_tzd);
            this->m_tvLcl = TVar8;
            *(byte *)&this->m_grfval = (byte)this->m_grfval | 1;
          }
          else {
            TVar8 = this->m_tvLcl;
          }
          DateUtilities::GetYmdFromTv(TVar8,&this->m_ymdLcl);
          *(byte *)&this->m_grfval = (byte)this->m_grfval | 2;
        }
        pDVar5 = (DateImplementation *)&this->m_tvLcl;
      }
      TVar8 = pDVar5->m_tvUtc;
      if (dd._value < 8) {
        dVar7 = (double)(*(code *)(&DAT_0112958c + *(int *)(&DAT_0112958c + (long)local_90[0] * 4)))
                                  ();
        return dVar7;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                  ,0x6fa,"(false)","DataData type invalid");
      if (!bVar3) goto LAB_00b3eae0;
      *puVar4 = 0;
    }
    this->m_grfval = 0;
    if (fUtc) {
      dVar7 = DoubleToTvUtc(TVar8);
    }
    else {
      dVar7 = GetTvUtc<Js::ScriptContext>(TVar8,scriptContext);
    }
  }
  else {
LAB_00b3e6f7:
    this->m_grfval = 0;
    dVar7 = NAN;
  }
  this->m_tvUtc = dVar7;
  this->field_0x58 = this->field_0x58 | 1;
  return dVar7;
}

Assistant:

double DateImplementation::SetDateData(Arguments args, DateData dd, bool fUtc, ScriptContext* scriptContext)
    {
        // This must accommodate the largest cvar in mpddcvar.
        double rgdbl[5];

        double tv = 0;
        DateTime::YMD *pymd = NULL;
        DateTime::YMD emptyYMD = {0};
        uint count = 0;

        uint cvarMax;
        uint ivar;

        // PREFAST: check limits
        if (dd < 0 || dd >= DateData::Lim)
        {
            AssertMsg(false, "DateData type invalid");
            Js::JavascriptError::ThrowError(scriptContext, VBSERR_InternalError);
        }

        // Get the parameters.
        cvarMax = mpddcvar[dd];

        __analysis_assume(cvarMax <= 4);

        //
        // arg[0] would be the date object itself
        //
        for (ivar = 0; (ivar < (args.Info.Count-1)) && ivar < cvarMax; ++ivar)
        {
            rgdbl[ivar] = JavascriptConversion::ToNumber(args[ivar+1],scriptContext);

            if (!Js::NumberUtilities::IsFinite(rgdbl[ivar]))
                goto LSetNan;

            rgdbl[ivar] = ConvertToInteger(rgdbl[ivar]);
        }

        if ((count = ivar) < 1)
        {
            goto LSetNan;
        }

        if (JavascriptNumber::IsNan(m_tvUtc))
        {


            // If the current time is not finite, the only way we can end up
            // with non-NaN is for setFullYear/setYear.
            // See ES5 15.9.5.40, ES5 B.2.5.
            if (!(DateData::FullYear == dd || DateData::Year == dd))
            {
                goto LSetNan;
            }
            pymd = &emptyYMD;           // We need mon, mday, time to be 0.
            // Fall through to DateData::Year and DataData::FullYear cases below.
        }
        else
        {
            if (fUtc)
            {
                EnsureYmdUtc();
                pymd = &m_ymdUtc;
                tv = m_tvUtc;
            }
            else
            {
                EnsureYmdLcl(scriptContext);
                pymd = &m_ymdLcl;
                tv = m_tvLcl;
            }
        }

        ivar = 0;
        switch (dd)
        {
        case DateData::Year:
            if (rgdbl[0] < 100 && rgdbl[0] >= 0)
                rgdbl[0] += 1900;
            // fall-through
        case DateData::FullYear:
    LFullYear:
            if (count < 3)
            {
                // Only {year} or {year, month} is specified. Day is not specified.
                rgdbl[2] = pymd->mday + 1;
                if (count < 2)
                {
                    // Month is not specified.
                    rgdbl[1] = pymd->mon;
                }
            }
            tv = TvFromDate(rgdbl[0], rgdbl[1], rgdbl[2] - 1, pymd->time);
            break;
        case DateData::Month:
            memmove(rgdbl + 1, rgdbl, count * sizeof(double));
            count++;
            rgdbl[0] = pymd->year;
            goto LFullYear;
        case DateData::Date:
            tv += (rgdbl[ivar] - pymd->mday - 1) * 86400000;
            if (++ivar >= count)
            {
                break;
            }
            // fall-through
        case DateData::Hours:
            tv += (rgdbl[ivar] - (pymd->time / 3600000)) * 3600000;
            if (++ivar >= count)
            {
                break;
            }
            // fall-through
        case DateData::Minutes:
            tv += (rgdbl[ivar] - (pymd->time / 60000) % 60) * 60000;
            if (++ivar >= count)
            {
                break;
            }
            // fall-through
        case DateData::Seconds:
            tv += (rgdbl[ivar] - (pymd->time / 1000) % 60) * 1000;
            if (++ivar >= count)
            {
                break;
            }
            // fall-through
        case DateData::Milliseconds:
            tv += rgdbl[ivar] - pymd->time % 1000;
            break;
        default:
            AssertMsg(false, "DataData type invalid");
        }

        if (fUtc)
        {
            SetTvUtc(tv);
        }
        else
        {
            SetTvLcl(tv, scriptContext);
        }

        m_modified = true;
        return m_tvUtc;

    LSetNan:
        m_grfval = 0;
        m_tvUtc = JavascriptNumber::NaN;
        m_modified = true;

        return m_tvUtc;
    }